

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitLir.c
# Opt level: O0

sljit_s32 get_arg_count(sljit_s32 arg_types)

{
  undefined4 local_10;
  undefined4 local_c;
  sljit_s32 arg_count;
  sljit_s32 arg_types_local;
  
  local_10 = 0;
  for (local_c = arg_types >> 4; local_c != 0; local_c = local_c >> 4) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static SLJIT_INLINE sljit_s32 get_arg_count(sljit_s32 arg_types)
{
	sljit_s32 arg_count = 0;

	arg_types >>= SLJIT_DEF_SHIFT;
	while (arg_types) {
		arg_count++;
		arg_types >>= SLJIT_DEF_SHIFT;
	}

	return arg_count;
}